

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void write_inter_segment_id
               (AV1_COMP *cpi,MACROBLOCKD *xd,aom_writer *w,segmentation *seg,
               segmentation_probs *segp,int skip,int preskip)

{
  aom_cdf_prob (*icdf) [3];
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MB_MODE_INFO *mbmi;
  short sVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  short sVar10;
  uint uVar11;
  uint8_t *__s;
  ulong uVar12;
  
  if (seg->update_map == '\0') {
    return;
  }
  mbmi = *xd->mi;
  iVar3 = xd->mi_row;
  iVar4 = xd->mi_col;
  if (preskip == 0) {
    if (seg->segid_preskip != '\0') {
      return;
    }
    if (skip != 0) {
      write_segment_id(cpi,xd,mbmi,w,seg,segp,1);
      if (seg->temporal_update == '\0') {
        return;
      }
      mbmi->field_0xa7 = mbmi->field_0xa7 & 0xf7;
      return;
    }
  }
  else if (seg->segid_preskip == '\0') {
    return;
  }
  if (seg->temporal_update != '\0') {
    if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)(*(ushort *)&xd->above_mbmi->field_0xa7 >> 3 & 1);
    }
    uVar11 = *(ushort *)&mbmi->field_0xa7 >> 3 & 1;
    if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = (ulong)(*(ushort *)&xd->left_mbmi->field_0xa7 >> 3 & 1);
    }
    icdf = segp->pred_cdf + uVar8 + uVar12;
    od_ec_encode_cdf_q15(&w->ec,uVar11,*icdf,2);
    sVar10 = (short)uVar11;
    if (w->allow_update_cdf != '\0') {
      uVar1 = (*icdf)[2];
      bVar7 = (char)(uVar1 >> 4) + 4;
      uVar2 = (*icdf)[0];
      if (sVar10 == 0) {
        sVar6 = -(uVar2 >> (bVar7 & 0x1f));
      }
      else {
        sVar6 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar7 & 0x1f));
      }
      (*icdf)[0] = sVar6 + uVar2;
      (*icdf)[2] = (*icdf)[2] + (ushort)(uVar1 < 0x20);
    }
    if (sVar10 != 0) {
      uVar11 = (cpi->common).mi_params.mi_rows - iVar3;
      if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [mbmi->bsize] <= (int)uVar11) {
        uVar11 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [mbmi->bsize];
      }
      if ((int)uVar11 < 1) {
        return;
      }
      bVar7 = mbmi->field_0xa7;
      iVar5 = (cpi->common).mi_params.mi_cols;
      __s = ((cpi->common).cur_frame)->seg_map + (iVar3 * iVar5 + iVar4);
      uVar9 = iVar5 - iVar4;
      if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [mbmi->bsize] <= (int)uVar9) {
        uVar9 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [mbmi->bsize];
      }
      uVar12 = (ulong)uVar11;
      do {
        memset(__s,(uint)(bVar7 & 7),(long)(int)uVar9);
        __s = __s + iVar5;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      return;
    }
  }
  write_segment_id(cpi,xd,mbmi,w,seg,segp,0);
  return;
}

Assistant:

static inline void write_inter_segment_id(AV1_COMP *cpi, MACROBLOCKD *const xd,
                                          aom_writer *w,
                                          const struct segmentation *const seg,
                                          struct segmentation_probs *const segp,
                                          int skip, int preskip) {
  MB_MODE_INFO *const mbmi = xd->mi[0];
  AV1_COMMON *const cm = &cpi->common;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  if (seg->update_map) {
    if (preskip) {
      if (!seg->segid_preskip) return;
    } else {
      if (seg->segid_preskip) return;
      if (skip) {
        write_segment_id(cpi, xd, mbmi, w, seg, segp, 1);
        if (seg->temporal_update) mbmi->seg_id_predicted = 0;
        return;
      }
    }
    if (seg->temporal_update) {
      const int pred_flag = mbmi->seg_id_predicted;
      aom_cdf_prob *pred_cdf = av1_get_pred_cdf_seg_id(segp, xd);
      aom_write_symbol(w, pred_flag, pred_cdf, 2);
      if (!pred_flag) {
        write_segment_id(cpi, xd, mbmi, w, seg, segp, 0);
      }
      if (pred_flag) {
        set_spatial_segment_id(&cm->mi_params, cm->cur_frame->seg_map,
                               mbmi->bsize, mi_row, mi_col, mbmi->segment_id);
      }
    } else {
      write_segment_id(cpi, xd, mbmi, w, seg, segp, 0);
    }
  }
}